

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Glucose::OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
          (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this,
          int *idx)

{
  uint uVar1;
  ClauseAllocator *pCVar2;
  int iVar3;
  long lVar4;
  vec<unsigned_int> *this_00;
  long lVar5;
  
  this_00 = (this->occs).data + *idx;
  pCVar2 = (this->deleted).ca;
  iVar3 = 0;
  for (lVar4 = 0; lVar4 < this_00->sz; lVar4 = lVar4 + 1) {
    uVar1 = this_00->data[lVar4];
    if (((pCVar2->super_RegionAllocator<unsigned_int>).memory[uVar1] & 3) != 1) {
      lVar5 = (long)iVar3;
      iVar3 = iVar3 + 1;
      this_00->data[lVar5] = uVar1;
    }
  }
  vec<unsigned_int>::shrink(this_00,(int)lVar4 - iVar3);
  (this->dirty).data[*idx] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}